

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O3

bool __thiscall QMimeMagicRule::matches(QMimeMagicRule *this,QByteArray *data)

{
  char cVar1;
  bool bVar2;
  code *pcVar3;
  long *plVar4;
  QMimeMagicRule *this_00;
  long lVar5;
  
  pcVar3 = (code *)this->m_matchFunction;
  if (pcVar3 == (code *)0x0) {
    return false;
  }
  plVar4 = (long *)((long)&(this->m_subMatches).d.d + *(long *)&this->field_0x80);
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
  }
  cVar1 = (*pcVar3)(plVar4,data);
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    lVar5 = (this->m_subMatches).d.size;
    if (lVar5 == 0) {
      bVar2 = true;
    }
    else {
      this_00 = (this->m_subMatches).d.ptr;
      lVar5 = lVar5 * 0x88;
      do {
        lVar5 = lVar5 + -0x88;
        bVar2 = matches(this_00,data);
        if (bVar2) {
          return bVar2;
        }
        this_00 = this_00 + 1;
      } while (lVar5 != 0);
    }
  }
  return bVar2;
}

Assistant:

bool QMimeMagicRule::matches(const QByteArray &data) const
{
    const bool ok = m_matchFunction && (this->*m_matchFunction)(data);
    if (!ok)
        return false;

    // No submatch? Then we are done.
    if (m_subMatches.isEmpty())
        return true;

    //qDebug() << "Checking" << m_subMatches.count() << "sub-rules";
    // Check that one of the submatches matches too
    for ( QList<QMimeMagicRule>::const_iterator it = m_subMatches.begin(), end = m_subMatches.end() ;
          it != end ; ++it ) {
        if ((*it).matches(data)) {
            // One of the hierarchies matched -> mimetype recognized.
            return true;
        }
    }
    return false;


}